

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)16>_> * __thiscall
vkt::geometry::anon_unknown_0::VaryingOutputCountTestInstance::createPipelineLayout
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,
          VaryingOutputCountTestInstance *this,DeviceInterface *vk,VkDevice device)

{
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar2;
  Move<vk::Handle<(vk::HandleType)21>_> *pMVar3;
  VkImage obj;
  VkDescriptorPool VVar4;
  deUint64 dVar5;
  Context *this_00;
  TextureFormat TVar6;
  void *pvVar7;
  undefined8 uVar8;
  VkCommandPool VVar9;
  undefined8 uVar10;
  VkDeviceSize VVar11;
  TextureFormat TVar12;
  TextureFormat TVar13;
  TextureFormat TVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  VkFormat VVar19;
  VkResult VVar20;
  deUint32 queueFamilyIndex;
  int iVar21;
  DescriptorSetLayoutBuilder *pDVar22;
  Allocator *pAVar23;
  DescriptorPoolBuilder *pDVar24;
  DeviceInterface *pDVar25;
  VkDevice device_00;
  VkQueue pVVar26;
  VkDescriptorSetLayout VVar27;
  Allocation *pAVar28;
  Vec4 *color;
  long lVar29;
  ulong size;
  VkCommandBufferAllocateInfo cmdBufferAllocateInfo;
  VkBufferCreateInfo bufferParams;
  undefined4 uStack_2b4;
  PixelBufferAccess destAccess;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_230;
  VkFence local_218;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_210;
  VkCommandPool local_1f8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_1f0;
  Move<vk::Handle<(vk::HandleType)16>_> *local_1d8;
  deUint64 local_1d0;
  PixelBufferAccess access;
  deUint32 local_1a0;
  deUint32 dStack_19c;
  VkSampleCountFlagBits VStack_198;
  VkImageTiling VStack_194;
  deUint32 local_188;
  undefined4 uStack_184;
  undefined8 local_160;
  int local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined4 local_138;
  int local_134;
  TextureLevel texture;
  undefined4 local_100 [2];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  TextureFormat local_e0;
  undefined8 local_d8;
  ulong local_d0;
  undefined1 local_c8 [20];
  undefined4 local_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_a0;
  undefined8 local_9c;
  undefined8 uStack_94;
  undefined4 local_8c;
  PixelBufferAccess local_88;
  TextureFormat texFormat;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  if (this->m_test == READ_TEXTURE) {
    local_c8._0_4_ = 255.0;
    local_c8._4_4_ = 0.0;
    local_c8._8_4_ = 0.0;
    local_c8._12_8_ = 0;
    local_b4 = 0x437f0000;
    local_b0 = 0;
    uStack_a8 = 0;
    local_a0 = 0x437f0000;
    local_9c = 0;
    uStack_94 = 0;
    local_8c = 0x437f0000;
    local_1d8 = __return_storage_ptr__;
    texFormat = glu::mapGLInternalFormat(0x8058);
    VVar19 = ::vk::mapTextureFormat(&texFormat);
    pAVar23 = Context::getDefaultAllocator
                        ((this->super_GeometryExpanderRenderTestInstance).super_TestInstance.
                         m_context);
    tcu::TextureLevel::TextureLevel(&texture,&texFormat,4,1,1);
    tcu::TextureLevel::getAccess(&access,&texture);
    if (0 < texture.m_size.m_data[0]) {
      color = (Vec4 *)local_c8;
      lVar29 = 0;
      do {
        tcu::PixelBufferAccess::setPixel(&access,color,(int)lVar29,0,0);
        lVar29 = lVar29 + 1;
        color = color + 1;
      } while (lVar29 < texture.m_size.m_data[0]);
    }
    access.super_ConstPixelBufferAccess.m_format.order = sRGB;
    access.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    access.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    access.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    access.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 1;
    access.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 4;
    access.super_ConstPixelBufferAccess.m_data._0_4_ = 1;
    access.super_ConstPixelBufferAccess.m_data._4_4_ = 1;
    access.super_ConstPixelBufferAccess.m_pitch.m_data[1] = VVar19;
    ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&cmdBufferAllocateInfo,vk,device,
                      (VkImageCreateInfo *)&access,(VkAllocationCallbacks *)0x0);
    uVar10 = cmdBufferAllocateInfo._24_8_;
    VVar9 = cmdBufferAllocateInfo.commandPool;
    pvVar7 = cmdBufferAllocateInfo.pNext;
    uVar8 = cmdBufferAllocateInfo._0_8_;
    bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
    bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
    bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
    bufferParams.sType = cmdBufferAllocateInfo.sType;
    bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
    bufferParams.pNext = cmdBufferAllocateInfo.pNext;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 0;
    pMVar2 = &this->m_texture;
    obj.m_internal =
         (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    if (obj.m_internal == 0) {
      (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
           (VkDevice)VVar9.m_internal;
      (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)uVar10;
      (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal = uVar8;
      (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)pvVar7;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&(this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,obj
                );
      (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
           (VkDevice)bufferParams._16_8_;
      (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)bufferParams.size;
      (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
           bufferParams._0_8_;
      (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)bufferParams.pNext;
      if (cmdBufferAllocateInfo._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&cmdBufferAllocateInfo.pNext,
                   (VkImage)cmdBufferAllocateInfo._0_8_);
      }
    }
    ::vk::getImageMemoryRequirements
              ((VkMemoryRequirements *)&bufferParams,vk,device,
               (VkImage)(pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                        m_internal);
    (*pAVar23->_vptr_Allocator[3])(&cmdBufferAllocateInfo,pAVar23,&bufferParams,0);
    uVar8 = cmdBufferAllocateInfo._0_8_;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    pAVar28 = (this->m_allocation).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    if (pAVar28 != (Allocation *)uVar8) {
      if (pAVar28 == (Allocation *)0x0) {
        (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
        m_data.ptr = (Allocation *)uVar8;
        pAVar28 = (Allocation *)uVar8;
      }
      else {
        (*pAVar28->_vptr_Allocation[1])();
        (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
        m_data.ptr = (Allocation *)uVar8;
        pAVar28 = (Allocation *)uVar8;
        if (cmdBufferAllocateInfo._0_8_ != 0) {
          (**(code **)(*(long *)cmdBufferAllocateInfo._0_8_ + 8))();
          pAVar28 = (this->m_allocation).
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
          ;
        }
      }
    }
    VVar20 = (*vk->_vptr_DeviceInterface[0xd])
                       (vk,device,
                        (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                        m_internal,(pAVar28->m_memory).m_internal);
    ::vk::checkResult(VVar20,
                      "vk.bindImageMemory(device, *m_texture, m_allocation->getMemory(), m_allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x199);
    this_00 = (this->super_GeometryExpanderRenderTestInstance).super_TestInstance.m_context;
    tcu::TextureLevel::getAccess(&local_88,&texture);
    local_1d0 = (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
    pDVar25 = Context::getDeviceInterface(this_00);
    device_00 = Context::getDevice(this_00);
    queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this_00);
    pVVar26 = Context::getUniversalQueue(this_00);
    pAVar23 = Context::getDefaultAllocator(this_00);
    iVar18 = local_88.super_ConstPixelBufferAccess.m_size.m_data[0];
    iVar21 = tcu::TextureFormat::getPixelSize((TextureFormat *)&local_88);
    size = (ulong)(uint)(local_88.super_ConstPixelBufferAccess.m_size.m_data[2] * iVar21 *
                        local_88.super_ConstPixelBufferAccess.m_size.m_data[1] * iVar18);
    DStack_230.m_device = (VkDevice)0x0;
    DStack_230.m_allocator = (VkAllocationCallbacks *)0x0;
    DStack_230.m_deviceIface = (DeviceInterface *)0x0;
    DStack_1f0.m_device = (VkDevice)0x0;
    DStack_1f0.m_allocator = (VkAllocationCallbacks *)0x0;
    local_1f8.m_internal = 0;
    DStack_1f0.m_deviceIface = (DeviceInterface *)0x0;
    DStack_210.m_device = (VkDevice)0x0;
    DStack_210.m_allocator = (VkAllocationCallbacks *)0x0;
    local_218.m_internal = 0;
    DStack_210.m_deviceIface = (DeviceInterface *)0x0;
    bufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    bufferParams.pNext = (void *)0x0;
    bufferParams._16_8_ = bufferParams._16_8_ & 0xffffffff00000000;
    bufferParams.usage = 1;
    bufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    bufferParams._40_8_ = (ulong)(uint)bufferParams._44_4_ << 0x20;
    bufferParams.pQueueFamilyIndices = (deUint32 *)0x0;
    bufferParams.size = size;
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&destAccess,pDVar25,device_00,
                       &bufferParams,(VkAllocationCallbacks *)0x0);
    uVar15 = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_;
    uVar8 = destAccess.super_ConstPixelBufferAccess._16_8_;
    cmdBufferAllocateInfo.pNext =
         (void *)destAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    TVar6 = destAccess.super_ConstPixelBufferAccess.m_format;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    uVar16 = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    uVar10 = destAccess.super_ConstPixelBufferAccess._16_8_;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    TVar12 = destAccess.super_ConstPixelBufferAccess.m_format;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)uVar15;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = SUB84(uVar15,4);
    cmdBufferAllocateInfo.level = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
    cmdBufferAllocateInfo.commandBufferCount =
         destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = (int)uVar8;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = SUB84(uVar8,4);
    cmdBufferAllocateInfo.commandPool.m_internal._0_4_ =
         destAccess.super_ConstPixelBufferAccess.m_size.m_data[2];
    cmdBufferAllocateInfo.commandPool.m_internal._4_4_ =
         destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0];
    destAccess.super_ConstPixelBufferAccess.m_format.order = TVar6.order;
    destAccess.super_ConstPixelBufferAccess.m_format.type = TVar6.type;
    cmdBufferAllocateInfo.sType = destAccess.super_ConstPixelBufferAccess.m_format.order;
    cmdBufferAllocateInfo._4_4_ = destAccess.super_ConstPixelBufferAccess.m_format.type;
    destAccess.super_ConstPixelBufferAccess.m_format = TVar12;
    destAccess.super_ConstPixelBufferAccess._16_8_ = uVar10;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_ = uVar16;
    ::vk::getBufferMemoryRequirements
              ((VkMemoryRequirements *)&cmdBufferAllocateInfo,pDVar25,device_00,(VkBuffer)TVar6);
    (*pAVar23->_vptr_Allocator[3])(&destAccess,pAVar23,&cmdBufferAllocateInfo,1);
    TVar12 = destAccess.super_ConstPixelBufferAccess.m_format;
    VVar20 = (*pDVar25->_vptr_DeviceInterface[0xc])
                       (pDVar25,device_00,TVar6,
                        *(undefined8 *)((long)destAccess.super_ConstPixelBufferAccess.m_format + 8),
                        *(undefined8 *)
                         ((long)destAccess.super_ConstPixelBufferAccess.m_format + 0x10));
    ::vk::checkResult(VVar20,
                      "vk.bindBufferMemory(device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x7a);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&cmdBufferAllocateInfo,pDVar25,device_00,1,
               queueFamilyIndex,(VkAllocationCallbacks *)0x0);
    uVar10 = cmdBufferAllocateInfo._24_8_;
    VVar9 = cmdBufferAllocateInfo.commandPool;
    pvVar7 = cmdBufferAllocateInfo.pNext;
    uVar8 = cmdBufferAllocateInfo._0_8_;
    bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
    bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
    bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
    bufferParams.sType = cmdBufferAllocateInfo.sType;
    bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
    bufferParams.pNext = cmdBufferAllocateInfo.pNext;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 0;
    if (local_1f8.m_internal == 0) {
      DStack_1f0.m_device = (VkDevice)VVar9.m_internal;
      DStack_1f0.m_allocator = (VkAllocationCallbacks *)uVar10;
      local_1f8.m_internal = uVar8;
      DStack_1f0.m_deviceIface = (DeviceInterface *)pvVar7;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_1f0,local_1f8);
      local_1f8.m_internal = bufferParams._0_8_;
      DStack_1f0.m_deviceIface = (DeviceInterface *)bufferParams.pNext;
      DStack_1f0.m_device = (VkDevice)bufferParams._16_8_;
      DStack_1f0.m_allocator = (VkAllocationCallbacks *)bufferParams.size;
      if (cmdBufferAllocateInfo._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&cmdBufferAllocateInfo.pNext,
                   (VkCommandPool)cmdBufferAllocateInfo._0_8_);
      }
    }
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = local_1f8.m_internal;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 1;
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)&destAccess,pDVar25,device_00,&cmdBufferAllocateInfo
              );
    uVar17 = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_;
    uVar16 = destAccess.super_ConstPixelBufferAccess._16_8_;
    uVar15 = destAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    TVar13 = destAccess.super_ConstPixelBufferAccess.m_format;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    uVar10 = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    uVar8 = destAccess.super_ConstPixelBufferAccess._16_8_;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    TVar14 = destAccess.super_ConstPixelBufferAccess.m_format;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)uVar17;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = SUB84(uVar17,4);
    bufferParams.size._0_4_ = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
    bufferParams.size._4_4_ = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = (int)uVar16;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = SUB84(uVar16,4);
    bufferParams.flags = destAccess.super_ConstPixelBufferAccess.m_size.m_data[2];
    bufferParams._20_4_ = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0];
    bufferParams.pNext = (void *)uVar15;
    destAccess.super_ConstPixelBufferAccess.m_format.order = TVar13.order;
    destAccess.super_ConstPixelBufferAccess.m_format.type = TVar13.type;
    bufferParams.sType = destAccess.super_ConstPixelBufferAccess.m_format.order;
    bufferParams._4_4_ = destAccess.super_ConstPixelBufferAccess.m_format.type;
    destAccess.super_ConstPixelBufferAccess.m_format = TVar14;
    destAccess.super_ConstPixelBufferAccess._16_8_ = uVar8;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_ = uVar10;
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&cmdBufferAllocateInfo,pDVar25,
                      device_00,0,(VkAllocationCallbacks *)0x0);
    uVar10 = cmdBufferAllocateInfo._24_8_;
    VVar9 = cmdBufferAllocateInfo.commandPool;
    pvVar7 = cmdBufferAllocateInfo.pNext;
    uVar8 = cmdBufferAllocateInfo._0_8_;
    bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
    bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
    bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
    bufferParams.sType = cmdBufferAllocateInfo.sType;
    bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
    bufferParams.pNext = cmdBufferAllocateInfo.pNext;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 0;
    if (local_218.m_internal == 0) {
      DStack_210.m_device = (VkDevice)VVar9.m_internal;
      DStack_210.m_allocator = (VkAllocationCallbacks *)uVar10;
      local_218.m_internal = uVar8;
      DStack_210.m_deviceIface = (DeviceInterface *)pvVar7;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_210,local_218);
      local_218.m_internal = bufferParams._0_8_;
      DStack_210.m_deviceIface = (DeviceInterface *)bufferParams.pNext;
      DStack_210.m_device = (VkDevice)bufferParams._16_8_;
      DStack_210.m_allocator = (VkAllocationCallbacks *)bufferParams.size;
      if (cmdBufferAllocateInfo._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&cmdBufferAllocateInfo.pNext,
                   (VkFence)cmdBufferAllocateInfo._0_8_);
      }
    }
    local_100[0] = 0x2c;
    local_f8 = 0;
    local_f0 = 0x80000004000;
    uStack_e8 = 0xffffffffffffffff;
    local_e0 = TVar6;
    local_d8 = 0;
    bufferParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    bufferParams.pNext = (void *)0x0;
    bufferParams.flags = 0;
    bufferParams._20_4_ = 0x1000;
    bufferParams.size = 0x700000000;
    bufferParams.usage = 0xffffffff;
    bufferParams.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
    bufferParams._40_8_ = local_1d0;
    bufferParams.pQueueFamilyIndices = (deUint32 *)&DAT_00000001;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0x2000001000;
    cmdBufferAllocateInfo.level = 7;
    cmdBufferAllocateInfo.commandBufferCount = 5;
    cmdBufferBeginInfo.flags = 1;
    cmdBufferBeginInfo._20_4_ = 0;
    cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
    cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
    cmdBufferBeginInfo._4_4_ = 0;
    cmdBufferBeginInfo.pNext = (void *)0x0;
    local_160 = 0;
    local_158 = local_88.super_ConstPixelBufferAccess.m_size.m_data[0];
    local_150 = 1;
    uStack_148 = 0x100000000;
    local_140 = 0;
    local_138 = 0;
    local_134 = local_88.super_ConstPixelBufferAccess.m_size.m_data[0];
    local_d0 = size;
    tcu::PixelBufferAccess::PixelBufferAccess
              (&destAccess,(TextureFormat *)&local_88,&local_88.super_ConstPixelBufferAccess.m_size,
               *(void **)((long)TVar12 + 0x18));
    tcu::copy((EVP_PKEY_CTX *)&destAccess,(EVP_PKEY_CTX *)&local_88);
    ::vk::flushMappedMemoryRange
              (pDVar25,device_00,(VkDeviceMemory)*(deUint64 *)((long)TVar12 + 8),
               *(VkDeviceSize *)((long)TVar12 + 0x10),size);
    VVar20 = (*pDVar25->_vptr_DeviceInterface[0x49])(pDVar25,TVar13,&cmdBufferBeginInfo);
    ::vk::checkResult(VVar20,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xe8);
    (*pDVar25->_vptr_DeviceInterface[0x6d])
              (pDVar25,TVar13,1,0x1000,0,0,0,1,local_100,1,&bufferParams);
    (*pDVar25->_vptr_DeviceInterface[0x62])(pDVar25,TVar13,TVar6,local_1d0,7,1,&local_160);
    (*pDVar25->_vptr_DeviceInterface[0x6d])
              (pDVar25,TVar13,0x1000,0x2000,0,0,0,0,0,1,&cmdBufferAllocateInfo);
    VVar20 = (*pDVar25->_vptr_DeviceInterface[0x4a])(pDVar25,TVar13);
    ::vk::checkResult(VVar20,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xec);
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_data = (void *)0x0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_format.order = LA;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    VVar20 = (*pDVar25->_vptr_DeviceInterface[2])
                       (pDVar25,pVVar26,1,&destAccess,local_218.m_internal);
    ::vk::checkResult(VVar20,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xfb);
    VVar20 = (*pDVar25->_vptr_DeviceInterface[0x16])
                       (pDVar25,device_00,1,&local_218,1,0xffffffffffffffff);
    ::vk::checkResult(VVar20,"vk.waitForFences(device, 1, &fence.get(), true, ~(0ull) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xfc);
    if (local_218.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_210,local_218);
    }
    TVar14 = destAccess.super_ConstPixelBufferAccess.m_format;
    if (TVar13 != (TextureFormat)0x0) {
      destAccess.super_ConstPixelBufferAccess.m_format.order = TVar13.order;
      destAccess.super_ConstPixelBufferAccess.m_format.type = TVar13.type;
      bufferParams.sType = destAccess.super_ConstPixelBufferAccess.m_format.order;
      bufferParams._4_4_ = destAccess.super_ConstPixelBufferAccess.m_format.type;
      destAccess.super_ConstPixelBufferAccess.m_format = TVar14;
      (**(code **)(*(long *)uVar15 + 0x240))(uVar15,uVar16,uVar17,1);
    }
    if (local_1f8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_1f0,local_1f8);
    }
    (**(code **)(*(long *)TVar12 + 8))(TVar12);
    if (TVar6 != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&DStack_230,(VkBuffer)TVar6);
    }
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)&bufferParams);
    pDVar22 = ::vk::DescriptorSetLayoutBuilder::addBinding
                        ((DescriptorSetLayoutBuilder *)&bufferParams,
                         VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1,8,(VkSampler *)0x0);
    ::vk::DescriptorSetLayoutBuilder::build
              ((Move<vk::Handle<(vk::HandleType)19>_> *)&destAccess,pDVar22,vk,device,0);
    uVar15 = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_;
    uVar10 = destAccess.super_ConstPixelBufferAccess._16_8_;
    uVar8 = destAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    TVar6 = destAccess.super_ConstPixelBufferAccess.m_format;
    cmdBufferAllocateInfo.commandPool.m_internal._0_4_ =
         destAccess.super_ConstPixelBufferAccess.m_size.m_data[2];
    cmdBufferAllocateInfo.commandPool.m_internal._4_4_ =
         destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0];
    cmdBufferAllocateInfo.level = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
    cmdBufferAllocateInfo.commandBufferCount =
         destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    cmdBufferAllocateInfo.sType = destAccess.super_ConstPixelBufferAccess.m_format.order;
    cmdBufferAllocateInfo._4_4_ = destAccess.super_ConstPixelBufferAccess.m_format.type;
    cmdBufferAllocateInfo.pNext =
         (void *)destAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    pMVar1 = &this->m_descriptorSetLayout;
    VVar27.m_internal =
         (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
         m_internal;
    if (VVar27.m_internal == 0) {
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_device = (VkDevice)uVar10;
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)uVar15;
      (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
           (deUint64)TVar6;
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)uVar8;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                  m_data.deleter,VVar27);
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_device = (VkDevice)cmdBufferAllocateInfo.commandPool.m_internal;
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)cmdBufferAllocateInfo._24_8_;
      (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
           cmdBufferAllocateInfo._0_8_;
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)cmdBufferAllocateInfo.pNext;
      if (destAccess.super_ConstPixelBufferAccess.m_format != (TextureFormat)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)19>_> *)
                   &destAccess.super_ConstPixelBufferAccess.m_size,
                   (VkDescriptorSetLayout)destAccess.super_ConstPixelBufferAccess.m_format);
      }
    }
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    if (bufferParams.pQueueFamilyIndices != (deUint32 *)0x0) {
      operator_delete(bufferParams.pQueueFamilyIndices,
                      CONCAT44(uStack_2b4,1) - (long)bufferParams.pQueueFamilyIndices);
    }
    if (bufferParams.size != 0) {
      operator_delete((void *)bufferParams.size,bufferParams._40_8_ - bufferParams.size);
    }
    if (bufferParams._0_8_ != 0) {
      operator_delete((void *)bufferParams._0_8_,bufferParams._16_8_ - bufferParams._0_8_);
    }
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&destAccess);
    pDVar24 = ::vk::DescriptorPoolBuilder::addType
                        ((DescriptorPoolBuilder *)&destAccess,
                         VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
    ::vk::DescriptorPoolBuilder::build
              ((Move<vk::Handle<(vk::HandleType)21>_> *)&cmdBufferAllocateInfo,pDVar24,vk,device,1,1
              );
    uVar10 = cmdBufferAllocateInfo._24_8_;
    VVar9 = cmdBufferAllocateInfo.commandPool;
    pvVar7 = cmdBufferAllocateInfo.pNext;
    uVar8 = cmdBufferAllocateInfo._0_8_;
    bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
    bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
    bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
    bufferParams.sType = cmdBufferAllocateInfo.sType;
    bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
    bufferParams.pNext = cmdBufferAllocateInfo.pNext;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 0;
    pMVar3 = &this->m_descriptorPool;
    VVar4.m_internal =
         (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
         m_internal;
    if (VVar4.m_internal == 0) {
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_device = (VkDevice)VVar9.m_internal;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)uVar10;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal = uVar8;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)pvVar7;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                  deleter,VVar4);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_device = (VkDevice)bufferParams._16_8_;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)bufferParams.size;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
           bufferParams._0_8_;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)bufferParams.pNext;
      if (cmdBufferAllocateInfo._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&cmdBufferAllocateInfo.pNext,
                   (VkDescriptorPool)cmdBufferAllocateInfo._0_8_);
      }
    }
    cmdBufferAllocateInfo.commandPool.m_internal = 0;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 0;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    if (destAccess.super_ConstPixelBufferAccess.m_format != (TextureFormat)0x0) {
      operator_delete((void *)destAccess.super_ConstPixelBufferAccess.m_format,
                      destAccess.super_ConstPixelBufferAccess._16_8_ -
                      (long)destAccess.super_ConstPixelBufferAccess.m_format);
    }
    makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&cmdBufferAllocateInfo,vk,device,
                      (VkDescriptorPool)
                      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                      m_internal,
                      (VkDescriptorSetLayout)
                      (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                      m_internal);
    uVar10 = cmdBufferAllocateInfo._24_8_;
    VVar9 = cmdBufferAllocateInfo.commandPool;
    pvVar7 = cmdBufferAllocateInfo.pNext;
    uVar8 = cmdBufferAllocateInfo._0_8_;
    bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
    bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
    bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
    bufferParams.sType = cmdBufferAllocateInfo.sType;
    bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
    bufferParams.pNext = cmdBufferAllocateInfo.pNext;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 0;
    TVar6 = (TextureFormat)
            (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
            m_internal;
    if (TVar6 == (TextureFormat)0x0) {
      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device
           = (VkDevice)VVar9.m_internal;
      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
      m_internal = uVar10;
      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
      m_internal = uVar8;
      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)pvVar7;
    }
    else {
      pDVar25 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                deleter.m_deviceIface;
      destAccess.super_ConstPixelBufferAccess.m_format = TVar6;
      (*pDVar25->_vptr_DeviceInterface[0x3d])
                (pDVar25,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                         m_data.deleter.m_device,
                 (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                 deleter.m_pool.m_internal,1);
      *(VkBufferCreateFlags *)
       &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
        m_device = bufferParams.flags;
      *(undefined4 *)
       ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_device + 4) = bufferParams._20_4_;
      *(int *)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal = (int)bufferParams.size;
      *(int *)((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_pool.m_internal + 4) = bufferParams.size._4_4_;
      *(VkStructureType *)
       &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
        m_internal = bufferParams.sType;
      *(undefined4 *)
       ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
               m_internal + 4) = bufferParams._4_4_;
      *(undefined4 *)
       &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
        m_deviceIface = bufferParams.pNext._0_4_;
      *(undefined4 *)
       ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_deviceIface + 4) = bufferParams.pNext._4_4_;
      if (cmdBufferAllocateInfo._0_8_ != 0) {
        bufferParams.sType = cmdBufferAllocateInfo.sType;
        bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
        (**(code **)(*cmdBufferAllocateInfo.pNext + 0x1e8))
                  (cmdBufferAllocateInfo.pNext,cmdBufferAllocateInfo.commandPool.m_internal,
                   cmdBufferAllocateInfo._24_8_,1);
      }
    }
    makePipelineLayout(local_1d8,vk,device,
                       (VkDescriptorSetLayout)
                       (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                       m_internal);
    tcu::TextureLevel::~TextureLevel(&texture);
    __return_storage_ptr__ = local_1d8;
  }
  else {
    if (this->m_test == READ_UNIFORM) {
      ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
                ((DescriptorSetLayoutBuilder *)&access);
      pDVar22 = ::vk::DescriptorSetLayoutBuilder::addBinding
                          ((DescriptorSetLayoutBuilder *)&access,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1
                           ,8,(VkSampler *)0x0);
      ::vk::DescriptorSetLayoutBuilder::build
                ((Move<vk::Handle<(vk::HandleType)19>_> *)&cmdBufferAllocateInfo,pDVar22,vk,device,0
                );
      uVar10 = cmdBufferAllocateInfo._24_8_;
      VVar9 = cmdBufferAllocateInfo.commandPool;
      pvVar7 = cmdBufferAllocateInfo.pNext;
      uVar8 = cmdBufferAllocateInfo._0_8_;
      bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
      bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
      bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
      bufferParams.sType = cmdBufferAllocateInfo.sType;
      bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
      bufferParams.pNext = cmdBufferAllocateInfo.pNext;
      cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      cmdBufferAllocateInfo._4_4_ = 0;
      cmdBufferAllocateInfo.pNext = (void *)0x0;
      cmdBufferAllocateInfo.commandPool.m_internal = 0;
      cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
      cmdBufferAllocateInfo.commandBufferCount = 0;
      pMVar1 = &this->m_descriptorSetLayout;
      VVar27.m_internal =
           (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
           object.m_internal;
      if (VVar27.m_internal == 0) {
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_device = (VkDevice)VVar9.m_internal;
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)uVar10;
        (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal = uVar8;
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)pvVar7;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                    m_data.deleter,VVar27);
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_device = (VkDevice)bufferParams._16_8_;
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)bufferParams.size;
        (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
             bufferParams._0_8_;
        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)bufferParams.pNext;
        if (cmdBufferAllocateInfo._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)19>_> *)&cmdBufferAllocateInfo.pNext,
                     (VkDescriptorSetLayout)cmdBufferAllocateInfo._0_8_);
        }
      }
      cmdBufferAllocateInfo.commandPool.m_internal = 0;
      cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
      cmdBufferAllocateInfo.commandBufferCount = 0;
      cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      cmdBufferAllocateInfo._4_4_ = 0;
      cmdBufferAllocateInfo.pNext = (void *)0x0;
      pvVar7 = (void *)CONCAT44(VStack_194,VStack_198);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,CONCAT44(uStack_184,local_188) - (long)pvVar7);
      }
      pvVar7 = (void *)CONCAT44(access.super_ConstPixelBufferAccess.m_pitch.m_data[2],
                                access.super_ConstPixelBufferAccess.m_pitch.m_data[1]);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,CONCAT44(dStack_19c,local_1a0) - (long)pvVar7);
      }
      if (access.super_ConstPixelBufferAccess.m_format != (TextureFormat)0x0) {
        operator_delete((void *)access.super_ConstPixelBufferAccess.m_format,
                        access.super_ConstPixelBufferAccess._16_8_ -
                        (long)access.super_ConstPixelBufferAccess.m_format);
      }
      ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
                ((DescriptorPoolBuilder *)&cmdBufferAllocateInfo);
      pDVar24 = ::vk::DescriptorPoolBuilder::addType
                          ((DescriptorPoolBuilder *)&cmdBufferAllocateInfo,
                           VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
      ::vk::DescriptorPoolBuilder::build
                ((Move<vk::Handle<(vk::HandleType)21>_> *)&bufferParams,pDVar24,vk,device,1,1);
      VVar11 = bufferParams.size;
      uVar10 = bufferParams._16_8_;
      pvVar7 = bufferParams.pNext;
      uVar8 = bufferParams._0_8_;
      access.super_ConstPixelBufferAccess.m_size.m_data[2] = bufferParams.flags;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[0] = bufferParams._20_4_;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)bufferParams.size;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)(bufferParams.size >> 0x20);
      access.super_ConstPixelBufferAccess.m_format.order = bufferParams.sType;
      access.super_ConstPixelBufferAccess.m_format.type = bufferParams._4_4_;
      access.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = bufferParams.pNext;
      bufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      bufferParams._4_4_ = 0;
      bufferParams.pNext = (void *)0x0;
      bufferParams.flags = 0;
      bufferParams._20_4_ = 0;
      bufferParams.size = 0;
      VVar4.m_internal =
           (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
           m_internal;
      if (VVar4.m_internal == 0) {
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_device = (VkDevice)uVar10;
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)VVar11;
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
        m_internal = uVar8;
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)pvVar7;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    deleter,VVar4);
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_device = (VkDevice)access.super_ConstPixelBufferAccess._16_8_;
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)
                      CONCAT44(access.super_ConstPixelBufferAccess.m_pitch.m_data[2],
                               access.super_ConstPixelBufferAccess.m_pitch.m_data[1]);
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
        m_internal = (deUint64)access.super_ConstPixelBufferAccess.m_format;
        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)access.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
        if (bufferParams._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&bufferParams.pNext,
                     (VkDescriptorPool)bufferParams._0_8_);
        }
      }
      bufferParams.flags = 0;
      bufferParams._20_4_ = 0;
      bufferParams.size = 0;
      bufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      bufferParams._4_4_ = 0;
      bufferParams.pNext = (void *)0x0;
      if (cmdBufferAllocateInfo._0_8_ != 0) {
        operator_delete((void *)cmdBufferAllocateInfo._0_8_,
                        cmdBufferAllocateInfo.commandPool.m_internal - cmdBufferAllocateInfo._0_8_);
      }
      makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferParams,vk,device,
                        (VkDescriptorPool)
                        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.
                        m_data.object.m_internal,
                        (VkDescriptorSetLayout)
                        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>
                        .m_data.object.m_internal);
      VVar11 = bufferParams.size;
      uVar10 = bufferParams._16_8_;
      pvVar7 = bufferParams.pNext;
      uVar8 = bufferParams._0_8_;
      access.super_ConstPixelBufferAccess.m_size.m_data[2] = bufferParams.flags;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[0] = bufferParams._20_4_;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)bufferParams.size;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[2] = bufferParams.size._4_4_;
      access.super_ConstPixelBufferAccess.m_format.order = bufferParams.sType;
      access.super_ConstPixelBufferAccess.m_format.type = bufferParams._4_4_;
      access.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = bufferParams.pNext;
      bufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      bufferParams._4_4_ = 0;
      bufferParams.pNext = (void *)0x0;
      bufferParams.flags = 0;
      bufferParams._20_4_ = 0;
      bufferParams.size = 0;
      dVar5 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
              m_internal;
      if (dVar5 == 0) {
        (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
        m_device = (VkDevice)uVar10;
        (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
        .m_internal = VVar11;
        (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
        m_internal = uVar8;
        (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)pvVar7;
      }
      else {
        pDVar25 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                  deleter.m_deviceIface;
        cmdBufferAllocateInfo._0_8_ = dVar5;
        (*pDVar25->_vptr_DeviceInterface[0x3d])
                  (pDVar25,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                           m_data.deleter.m_device,
                   (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                   deleter.m_pool.m_internal,1);
        *(int *)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                 deleter.m_device = access.super_ConstPixelBufferAccess.m_size.m_data[2];
        *(int *)((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                        m_data.deleter.m_device + 4) =
             access.super_ConstPixelBufferAccess.m_pitch.m_data[0];
        *(int *)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                 deleter.m_pool.m_internal = access.super_ConstPixelBufferAccess.m_pitch.m_data[1];
        *(int *)((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                        m_data.deleter.m_pool.m_internal + 4) =
             access.super_ConstPixelBufferAccess.m_pitch.m_data[2];
        *(ChannelOrder *)
         &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
          m_internal = access.super_ConstPixelBufferAccess.m_format.order;
        *(ChannelType *)
         ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                 object.m_internal + 4) = access.super_ConstPixelBufferAccess.m_format.type;
        *(int *)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                 deleter.m_deviceIface = access.super_ConstPixelBufferAccess.m_size.m_data[0];
        *(int *)((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                        m_data.deleter.m_deviceIface + 4) =
             access.super_ConstPixelBufferAccess.m_size.m_data[1];
        if (bufferParams._0_8_ != 0) {
          access.super_ConstPixelBufferAccess.m_format.order = bufferParams.sType;
          access.super_ConstPixelBufferAccess.m_format.type = bufferParams._4_4_;
          (**(code **)(*bufferParams.pNext + 0x1e8))
                    (bufferParams.pNext,bufferParams._16_8_,bufferParams.size,1);
        }
      }
      VVar27.m_internal =
           (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
    }
    else {
      VVar27.m_internal = 0;
    }
    makePipelineLayout(__return_storage_ptr__,vk,device,VVar27);
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipelineLayout> VaryingOutputCountTestInstance::createPipelineLayout (const DeviceInterface& vk, const VkDevice device)
{
	if (m_test == READ_UNIFORM)
	{
		m_descriptorSetLayout	=	DescriptorSetLayoutBuilder()
									.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_GEOMETRY_BIT)
									.build(vk, device);
		m_descriptorPool		=	DescriptorPoolBuilder()
									.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
									.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);
		m_descriptorSet			=	makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

		return makePipelineLayout(vk, device, *m_descriptorSetLayout);
	}
	else if (m_test == READ_TEXTURE)
	{
		const tcu::Vec4				data[4]				=
														{
															tcu::Vec4(255, 0, 0, 0),
															tcu::Vec4(0, 255, 0, 0),
															tcu::Vec4(0, 0, 255, 0),
															tcu::Vec4(0, 0, 0, 255)
														};
		const tcu::UVec2			viewportSize		(4, 1);
		const tcu::TextureFormat	texFormat			= glu::mapGLInternalFormat(GL_RGBA8);
		const VkFormat				format				= mapTextureFormat(texFormat);
		const VkImageUsageFlags		imageUsageFlags		= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
		Allocator&					memAlloc			= m_context.getDefaultAllocator();
		tcu::TextureLevel			texture				(texFormat, static_cast<int>(viewportSize.x()), static_cast<int>(viewportSize.y()));

		// Fill with data
		{
			tcu::PixelBufferAccess access = texture.getAccess();
			for (int x = 0; x < texture.getWidth(); ++x)
				access.setPixel(data[x], x, 0);
		}
		// Create image
		const VkImageCreateInfo			imageParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,								// const void*				pNext;
			0,										// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,						// VkImageType				imageType;
			format,									// VkFormat					format;
			{										// VkExtent3D				extent;
					viewportSize.x(),
					viewportSize.y(),
					1u,
			},
			1u,							// deUint32					mipLevels;
			1u,							// deUint32					arrayLayers;
			VK_SAMPLE_COUNT_1_BIT,		// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,	// VkImageTiling			tiling;
			imageUsageFlags,			// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,	// VkSharingMode			sharingMode;
			0u,							// deUint32					queueFamilyIndexCount;
			DE_NULL,					// const deUint32*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED	// VkImageLayout			initialLayout;
		};

		m_texture		= createImage(vk, device, &imageParams);
		m_allocation	= memAlloc.allocate(getImageMemoryRequirements(vk, device, *m_texture), MemoryRequirement::Any);
		VK_CHECK(vk.bindImageMemory(device, *m_texture, m_allocation->getMemory(), m_allocation->getOffset()));
		uploadImage(m_context, texture.getAccess(), *m_texture);

		m_descriptorSetLayout	=	DescriptorSetLayoutBuilder()
									.addSingleBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, VK_SHADER_STAGE_GEOMETRY_BIT)
									.build(vk, device);
		m_descriptorPool		=	DescriptorPoolBuilder()
									.addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
									.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);
		m_descriptorSet			=	makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

		return makePipelineLayout(vk, device, *m_descriptorSetLayout);
	}
	else
		return makePipelineLayout(vk, device);
}